

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

void singlevar(LexState *ls,expdesc *var)

{
  FuncState *fs;
  int iVar1;
  TString *n;
  expdesc local_58;
  
  n = str_checkname(ls);
  fs = ls->fs;
  singlevaraux(fs,n,var,1);
  if (var->k == VVOID) {
    local_58.ravi_type_map = 0;
    local_58._36_4_ = 0;
    local_58.usertype = (TString *)0x0;
    local_58.pc = 0;
    local_58._52_4_ = 0;
    local_58.k = VVOID;
    local_58._4_4_ = 0;
    local_58.u.ival = 0;
    local_58.u.ind.usertype = (TString *)0x0;
    local_58.t = 0;
    local_58.f = 0;
    singlevaraux(fs,ls->envn,var,1);
    if (var->k == VVOID) {
      __assert_fail("var->k != VVOID",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                    ,0x26c,"void singlevar(LexState *, expdesc *)");
    }
    iVar1 = luaK_stringK(ls->fs,n);
    local_58.t = -1;
    local_58.f = -1;
    local_58.k = VK;
    local_58.u.info = iVar1;
    local_58.ravi_type_map = 0x100;
    local_58.usertype = (TString *)0x0;
    local_58.pc = -1;
    local_58.u.ind.usertype = (TString *)0x0;
    luaK_indexed(fs,var,&local_58);
  }
  return;
}

Assistant:

static void singlevar (LexState *ls, expdesc *var) {
  TString *varname = str_checkname(ls);
  FuncState *fs = ls->fs;
  singlevaraux(fs, varname, var, 1);
  if (var->k == VVOID) {  /* global name? */
    expdesc key = {.ravi_type_map = RAVI_TM_ANY, .pc = -1};
    singlevaraux(fs, ls->envn, var, 1);  /* get environment variable */
    lua_assert(var->k != VVOID);  /* this one must exist */
    codestring(ls, &key, varname);  /* key is variable name */
    luaK_indexed(fs, var, &key);  /* env[varname] */
  }
}